

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestSubNinja::Run(ParserTestSubNinja *this)

{
  State *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  StringPiece path;
  StringPiece path_00;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"test.ninja",&local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"var = inner\nbuild $builddir/inner: varref\n",&local_72);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "builddir = some_dir/\nrule varref\n  command = varref $var\nvar = outer\nbuild $builddir/outer: varref\nsubninja test.ninja\nbuild $builddir/outer2: varref\n"
            );
  if (iVar1 == g_current_test->assertion_failures_) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_ParserTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ParserTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x371,"1u == fs_.files_read_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      bVar3 = std::operator==("test.ninja",
                              (this->super_ParserTest).fs_.files_read_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x373,"\"test.ninja\" == fs_.files_read_[0]");
      pTVar2 = g_current_test;
      this_00 = &(this->super_ParserTest).state;
      path.len_ = 0xe;
      path.str_ = "some_dir/outer";
      pNVar4 = State::LookupNode(this_00,path);
      testing::Test::Check
                (pTVar2,pNVar4 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x374,"state.LookupNode(\"some_dir/outer\")");
      pTVar2 = g_current_test;
      path_00.len_ = 0xe;
      path_00.str_ = "some_dir/inner";
      pNVar4 = State::LookupNode(this_00,path_00);
      testing::Test::Check
                (pTVar2,pNVar4 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x376,"state.LookupNode(\"some_dir/inner\")");
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_ParserTest).state.edges_.
                               super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(this->super_ParserTest).state.edges_.
                               super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                               super__Vector_impl_data._M_start == 0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                         ,0x378,"3u == state.edges_.size()");
      pTVar2 = g_current_test;
      if (bVar3) {
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   *(this->super_ParserTest).state.edges_.
                    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,false);
        bVar3 = std::operator==("varref outer",&local_70);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x379,"\"varref outer\" == state.edges_[0]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_70);
        pTVar2 = g_current_test;
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   (this->super_ParserTest).state.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[1],false);
        bVar3 = std::operator==("varref inner",&local_70);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37a,"\"varref inner\" == state.edges_[1]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_70);
        pTVar2 = g_current_test;
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   (this->super_ParserTest).state.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[2],false);
        bVar3 = std::operator==("varref outer",&local_70);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37b,"\"varref outer\" == state.edges_[2]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, SubNinja) {
  fs_.Create("test.ninja",
    "var = inner\n"
    "build $builddir/inner: varref\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"builddir = some_dir/\n"
"rule varref\n"
"  command = varref $var\n"
"var = outer\n"
"build $builddir/outer: varref\n"
"subninja test.ninja\n"
"build $builddir/outer2: varref\n"));
  ASSERT_EQ(1u, fs_.files_read_.size());

  EXPECT_EQ("test.ninja", fs_.files_read_[0]);
  EXPECT_TRUE(state.LookupNode("some_dir/outer"));
  // Verify our builddir setting is inherited.
  EXPECT_TRUE(state.LookupNode("some_dir/inner"));

  ASSERT_EQ(3u, state.edges_.size());
  EXPECT_EQ("varref outer", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("varref inner", state.edges_[1]->EvaluateCommand());
  EXPECT_EQ("varref outer", state.edges_[2]->EvaluateCommand());
}